

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

void __thiscall Clasp::Cli::ClaspAppBase::run(ClaspAppBase *this)

{
  bool bVar1;
  Output *pOVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ClaspFacade *pCVar7;
  long *in_RDI;
  bad_alloc *anon_var_0;
  exception *e;
  Span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  Span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_18;
  
  pOVar2 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x116f2f);
  if (pOVar2 != (Output *)0x0) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_ffffffffffffffa0);
    if (bVar1) {
      local_18 = Potassco::toSpan<std::__cxx11::string>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            stdinStr_abi_cxx11_,1);
    }
    else {
      local_18 = Potassco::
                 toSpan<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           (in_stack_ffffffffffffff90);
    }
    pOVar2 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x116f97);
    uVar3 = (**(code **)*in_RDI)();
    uVar4 = (**(code **)(*in_RDI + 8))();
    pbVar5 = Potassco::begin<std::__cxx11::string>(&local_18);
    pbVar6 = Potassco::end<std::__cxx11::string>
                       ((Span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x116fd4);
    (*(pOVar2->super_EventHandler).super_ModelHandler._vptr_ModelHandler[5])
              (pOVar2,uVar3,uVar4,pbVar5,pbVar6);
  }
  pCVar7 = SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject>::operator*
                     ((SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject> *)0x117002);
  (**(code **)(*in_RDI + 0xb0))(in_RDI,pCVar7);
  return;
}

Assistant:

void ClaspAppBase::run() {
	if (out_.get()) {
		Potassco::Span<std::string> in = !claspAppOpts_.input.empty() ? Potassco::toSpan(claspAppOpts_.input) : Potassco::toSpan(&stdinStr, 1);
		out_->run(getName(), getVersion(), Potassco::begin(in), Potassco::end(in));
	}
	try        { run(*clasp_); }
	catch(...) {
		try { blockSignals(); setExitCode(E_ERROR); throw; }
		catch (const std::bad_alloc&  ) { setExitCode(E_MEMORY); error("std::bad_alloc"); }
		catch (const std::exception& e) { error(e.what()); }
		catch (...)                     { ; }
	}
}